

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O3

bool __thiscall Fossilize::DumbDirectoryDatabase::prepare(DumbDirectoryDatabase *this)

{
  bool bVar1;
  int iVar2;
  DIR *__dirp;
  dirent *pdVar3;
  bool bVar4;
  uint tag;
  uint64_t value;
  ResourceTag local_4c;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *local_48;
  Hash local_40;
  _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_38;
  
  bVar4 = true;
  if (this->mode != OverWrite) {
    __dirp = opendir((this->base_directory)._M_dataplus._M_p);
    if (__dirp == (DIR *)0x0) {
LAB_001454b0:
      bVar4 = false;
    }
    else {
      pdVar3 = readdir(__dirp);
      if (pdVar3 != (dirent *)0x0) {
        local_48 = this->seen_blobs;
        do {
          if ((shutdown_requested & 1) != 0) goto LAB_001454b0;
          if (pdVar3->d_type == '\b') {
            iVar2 = __isoc99_sscanf(pdVar3->d_name,"%x.%lx.json",&local_4c,&local_40);
            if ((iVar2 == 2) && (local_4c < RESOURCE_COUNT)) {
              bVar1 = DatabaseInterface::test_resource_filter
                                (&this->super_DatabaseInterface,local_4c,local_40);
              if (bVar1) {
                local_38 = (_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                            *)(local_48 + local_4c);
                std::
                _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                ::
                _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                          (local_38,&local_40,&local_38);
              }
            }
          }
          pdVar3 = readdir(__dirp);
        } while (pdVar3 != (dirent *)0x0);
      }
      closedir(__dirp);
    }
  }
  return bVar4;
}

Assistant:

bool prepare() override
	{
		if (mode == DatabaseMode::OverWrite)
			return true;

		DIR *dp = opendir(base_directory.c_str());
		if (!dp)
			return false;

		while (auto *pEntry = readdir(dp))
		{
			if (shutdown_requested.load(std::memory_order_relaxed))
				return false;

			if (pEntry->d_type != DT_REG)
				continue;

			unsigned tag;
			uint64_t value;
			if (sscanf(pEntry->d_name, "%x.%" SCNx64 ".json", &tag, &value) != 2)
				continue;

			if (tag >= RESOURCE_COUNT)
				continue;

			if (test_resource_filter(static_cast<ResourceTag>(tag), value))
				seen_blobs[tag].insert(value);
		}

		closedir(dp);
		return true;
	}